

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_quadratic_model.hpp
# Opt level: O2

void __thiscall
cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Sparse>::add_variable
          (BinaryQuadraticModel<unsigned_int,_double,_cimod::Sparse> *this,uint *v,double *bias)

{
  double dVar1;
  double *pdVar2;
  
  _add_new_label(this,*v);
  dVar1 = *bias;
  pdVar2 = _mat(this,*v);
  *pdVar2 = dVar1 + *pdVar2;
  return;
}

Assistant:

void add_variable( const IndexType &v, const FloatType &bias ) {
      // add new label if not exist
      _add_new_label( v );
      _mat( v ) += bias;
    }